

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# el.c
# Opt level: O0

wchar_t el_editmode(EditLine *el,wchar_t argc,wchar_t **argv)

{
  wchar_t *__s1;
  int iVar1;
  wchar_t *how;
  wchar_t **argv_local;
  wchar_t argc_local;
  EditLine *el_local;
  
  if (((argv == (wchar_t **)0x0) || (argc != L'\x02')) || (argv[1] == (wchar_t *)0x0)) {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    __s1 = argv[1];
    iVar1 = wcscmp(__s1,anon_var_dwarf_87d9 + 0xc);
    if (iVar1 == 0) {
      el->el_flags = el->el_flags & 0xfffffffb;
      tty_rawmode(el);
    }
    else {
      iVar1 = wcscmp(__s1,anon_var_dwarf_2f50);
      if (iVar1 != 0) {
        fprintf((FILE *)el->el_errfile,"edit: Bad value `%ls\'.\n",__s1);
        return L'\xffffffff';
      }
      tty_cookedmode(el);
      el->el_flags = el->el_flags | 4;
    }
    el_local._4_4_ = L'\0';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
/*ARGSUSED*/
el_editmode(EditLine *el, int argc, const wchar_t **argv)
{
	const wchar_t *how;

	if (argv == NULL || argc != 2 || argv[1] == NULL)
		return -1;

	how = argv[1];
	if (wcscmp(how, L"on") == 0) {
		el->el_flags &= ~EDIT_DISABLED;
		tty_rawmode(el);
	} else if (wcscmp(how, L"off") == 0) {
		tty_cookedmode(el);
		el->el_flags |= EDIT_DISABLED;
	}
	else {
		(void) fprintf(el->el_errfile, "edit: Bad value `%ls'.\n",
		    how);
		return -1;
	}
	return 0;
}